

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O0

int ichol(double *A,int N)

{
  int iVar1;
  int sc;
  int N_local;
  double *A_local;
  
  iVar1 = icholu(A,N);
  return iVar1;
}

Assistant:

int ichol(double *A, int N) {
	int sc;
	sc = icholu(A,N);
	return sc;
}